

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_field.cc
# Opt level: O3

void google::protobuf::compiler::cpp::AddAccessorAnnotations
               (FieldDescriptor *descriptor,Options *options,
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *variables)

{
  int iVar1;
  pointer pcVar2;
  StringPiece prepared_template_00;
  StringPiece prepared_template_01;
  StringPiece prepared_template_02;
  StringPiece prepared_template_03;
  StringPiece prepared_template_04;
  StringPiece prepared_template_05;
  StringPiece prepared_template_06;
  StringPiece prepared_template_07;
  StringPiece prepared_template_08;
  StringPiece prepared_template_09;
  StringPiece prepared_template_10;
  StringPiece access_type;
  StringPiece access_type_00;
  StringPiece access_type_01;
  StringPiece access_type_02;
  StringPiece access_type_03;
  StringPiece access_type_04;
  StringPiece access_type_05;
  StringPiece access_type_06;
  StringPiece access_type_07;
  StringPiece access_type_08;
  StringPiece access_type_09;
  StringPiece substitute_template_prefix_00;
  StringPiece substitute_template_prefix_01;
  StringPiece substitute_template_prefix_02;
  StringPiece substitute_template_prefix_03;
  StringPiece substitute_template_prefix_04;
  StringPiece substitute_template_prefix_05;
  StringPiece substitute_template_prefix_06;
  StringPiece substitute_template_prefix_07;
  StringPiece substitute_template_prefix_08;
  StringPiece substitute_template_prefix_09;
  StringPiece substitute_template_prefix_10;
  size_type sVar3;
  int iVar4;
  bool bVar5;
  byte bVar6;
  char cVar7;
  bool bVar8;
  mapped_type *pmVar9;
  long *plVar10;
  AlphaNum *e;
  FieldDescriptor *extraout_RDX;
  FieldDescriptor *extraout_RDX_00;
  FieldDescriptor *extraout_RDX_01;
  FieldDescriptor *extraout_RDX_02;
  FieldDescriptor *extraout_RDX_03;
  FieldDescriptor *extraout_RDX_04;
  FieldDescriptor *extraout_RDX_05;
  FieldDescriptor *pFVar11;
  char *pcVar12;
  FieldDescriptor *field;
  FieldDescriptor *extraout_RDX_06;
  FieldDescriptor *extraout_RDX_07;
  char *pcVar13;
  string *psVar14;
  _Alloc_hider _Var15;
  long lVar16;
  StringPiece annotation_name;
  StringPiece annotation_name_00;
  StringPiece annotation_name_01;
  StringPiece annotation_name_02;
  StringPiece annotation_name_03;
  StringPiece annotation_name_04;
  StringPiece annotation_name_05;
  StringPiece annotation_name_06;
  StringPiece annotation_name_07;
  StringPiece annotation_name_08;
  StringPiece annotation_name_09;
  StringPiece field_member_00;
  AlphaNum *pAVar17;
  string substitute_template_prefix;
  undefined1 local_4b0 [48];
  string prepared_template;
  string field_member;
  string prepared_flat_template;
  AlphaNum local_420;
  string prepared_add_template;
  undefined1 local_3d0 [48];
  AlphaNum local_3a0;
  undefined1 local_370 [48];
  AlphaNum local_340;
  AlphaNum local_310;
  key_type local_2e0;
  string proto_ns;
  string field_pointer;
  SubstituteArg local_280;
  string default_value_pointer;
  SubstituteArg local_230;
  SubstituteArg local_200;
  string field_name;
  string local_1b0;
  string local_190;
  string local_170;
  SubstituteArg local_150;
  SubstituteArg local_120;
  SubstituteArg local_f0;
  SubstituteArg local_c0;
  SubstituteArg local_90;
  SubstituteArg local_60;
  
  lVar16 = 0;
  do {
    std::__cxx11::string::string
              ((string *)local_4b0,
               *(char **)((long)AddAccessorAnnotations::kAccessorsAnnotations + lVar16),
               (allocator *)&local_420);
    pmVar9 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](variables,(key_type *)local_4b0);
    pAVar17 = (AlphaNum *)0x0;
    std::__cxx11::string::_M_replace((ulong)pmVar9,0,(char *)pmVar9->_M_string_length,0x3d75d9);
    pFVar11 = extraout_RDX;
    if ((undefined1 *)local_4b0._0_8_ != local_4b0 + 0x10) {
      operator_delete((void *)local_4b0._0_8_);
      pFVar11 = extraout_RDX_00;
    }
    lVar16 = lVar16 + 8;
  } while (lVar16 != 0x58);
  if (options->annotate_accessor == true) {
    lVar16 = 0;
    do {
      local_4b0._0_8_ = "  ";
      local_4b0._8_8_ = 2;
      FieldName_abi_cxx11_((string *)local_370,(cpp *)descriptor,pFVar11);
      local_420.piece_data_ = (char *)local_370._0_8_;
      local_420.piece_size_ = local_370._8_8_;
      local_3a0.piece_data_ = "_AccessedNoStrip = true;\n";
      local_3a0.piece_size_ = 0x19;
      StrCat_abi_cxx11_((string *)&local_340,(protobuf *)local_4b0,&local_420,&local_3a0,pAVar17);
      std::__cxx11::string::string
                ((string *)&local_310,
                 *(char **)((long)AddAccessorAnnotations::kAccessorsAnnotations + lVar16),
                 (allocator *)&local_200);
      pmVar9 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](variables,(key_type *)&local_310);
      std::__cxx11::string::operator=((string *)pmVar9,(string *)&local_340);
      pFVar11 = extraout_RDX_01;
      if (local_310.piece_data_ != local_310.digits) {
        operator_delete(local_310.piece_data_);
        pFVar11 = extraout_RDX_02;
      }
      if (local_340.piece_data_ != local_340.digits) {
        operator_delete(local_340.piece_data_);
        pFVar11 = extraout_RDX_03;
      }
      if ((AlphaNum *)local_370._0_8_ != (AlphaNum *)(local_370 + 0x10)) {
        operator_delete((void *)local_370._0_8_);
        pFVar11 = extraout_RDX_04;
      }
      lVar16 = lVar16 + 8;
    } while (lVar16 != 0x58);
  }
  if ((options->field_listener_options).inject_field_listener_events != true) {
    return;
  }
  if (*(int *)(*(long *)(*(long *)((AlphaNum *)descriptor)->digits + 0x78) + 0xa0) == 3) {
    return;
  }
  local_4b0._0_8_ = local_4b0 + 0x10;
  e = (AlphaNum *)descriptor;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_4b0,"field_member","");
  pmVar9 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,(key_type *)local_4b0);
  field_member._M_dataplus._M_p = (pointer)&field_member.field_2;
  pcVar2 = (pmVar9->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&field_member,pcVar2,pcVar2 + pmVar9->_M_string_length);
  if ((undefined1 *)local_4b0._0_8_ != local_4b0 + 0x10) {
    operator_delete((void *)local_4b0._0_8_);
  }
  lVar16 = *(long *)(((AlphaNum *)descriptor)->digits + 0x18);
  bVar8 = true;
  if ((lVar16 != 0 && ((ulong)((AlphaNum *)descriptor)->piece_data_ & 0x1000) != 0) &&
     ((*(int *)(lVar16 + 4) != 1 || ((*(byte *)(*(long *)(lVar16 + 0x20) + 1) & 2) == 0)))) {
    local_4b0._0_8_ = **(undefined8 **)(lVar16 + 8);
    local_4b0._8_8_ = (*(undefined8 **)(lVar16 + 8))[1];
    local_420.piece_data_ = "_.";
    local_420.piece_size_ = 2;
    local_3a0.piece_size_ =
         CONCAT44(field_member._M_string_length._4_4_,(int)field_member._M_string_length);
    local_3a0.piece_data_ = field_member._M_dataplus._M_p;
    StrCat_abi_cxx11_((string *)&local_340,(protobuf *)local_4b0,&local_420,&local_3a0,pAVar17);
    std::__cxx11::string::operator=((string *)&field_member,(string *)&local_340);
    if (local_340.piece_data_ != local_340.digits) {
      operator_delete(local_340.piece_data_);
    }
    bVar8 = false;
  }
  local_4b0._0_8_ = local_4b0 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_4b0,"proto_ns","");
  pmVar9 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,(key_type *)local_4b0);
  proto_ns._M_dataplus._M_p = (pointer)&proto_ns.field_2;
  pcVar2 = (pmVar9->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&proto_ns,pcVar2,pcVar2 + pmVar9->_M_string_length);
  if ((undefined1 *)local_4b0._0_8_ != local_4b0 + 0x10) {
    operator_delete((void *)local_4b0._0_8_);
  }
  substitute_template_prefix._M_dataplus._M_p = (pointer)&substitute_template_prefix.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&substitute_template_prefix,"  _tracker_.$1<$0>(this, ","");
  prepared_template._M_dataplus._M_p = (pointer)&prepared_template.field_2;
  prepared_template._M_string_length = 0;
  prepared_template.field_2._M_local_buf[0] = '\0';
  prepared_flat_template._M_dataplus._M_p = (pointer)&prepared_flat_template.field_2;
  prepared_flat_template._M_string_length = 0;
  prepared_flat_template.field_2._M_local_buf[0] = '\0';
  prepared_add_template._M_dataplus._M_p = (pointer)&prepared_add_template.field_2;
  prepared_add_template._M_string_length = 0;
  prepared_add_template.field_2._M_local_buf[0] = '\0';
  if ((~*(byte *)((long)&((AlphaNum *)descriptor)->piece_data_ + 1) & 0x60) == 0) {
    if (*(once_flag **)(((AlphaNum *)descriptor)->digits + 8) != (once_flag *)0x0) {
      local_4b0._0_8_ = FieldDescriptor::TypeOnceInit;
      local_420.piece_data_ = (char *)descriptor;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(((AlphaNum *)descriptor)->digits + 8),
                 (_func_void_FieldDescriptor_ptr **)local_4b0,(FieldDescriptor **)&local_420);
      descriptor = (FieldDescriptor *)e;
      e = (AlphaNum *)descriptor;
    }
    if ((*(char *)((long)&((AlphaNum *)descriptor)->piece_data_ + 2) == '\v') &&
       (bVar5 = FieldDescriptor::is_map_message_type(descriptor), descriptor = (FieldDescriptor *)e,
       e = (AlphaNum *)descriptor, bVar5)) goto LAB_002de11d;
    if (*(once_flag **)(((AlphaNum *)descriptor)->digits + 8) != (once_flag *)0x0) {
      local_4b0._0_8_ = FieldDescriptor::TypeOnceInit;
      local_420.piece_data_ = (char *)descriptor;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(((AlphaNum *)descriptor)->digits + 8),
                 (_func_void_FieldDescriptor_ptr **)local_4b0,(FieldDescriptor **)&local_420);
      descriptor = (FieldDescriptor *)e;
      e = (AlphaNum *)descriptor;
    }
    cVar7 = *(char *)((long)&((AlphaNum *)descriptor)->piece_data_ + 2);
    if (cVar7 != '\v') {
      if (*(once_flag **)(((AlphaNum *)descriptor)->digits + 8) != (once_flag *)0x0) {
        local_4b0._0_8_ = FieldDescriptor::TypeOnceInit;
        local_420.piece_data_ = (char *)descriptor;
        std::
        call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                  (*(once_flag **)(((AlphaNum *)descriptor)->digits + 8),
                   (_func_void_FieldDescriptor_ptr **)local_4b0,(FieldDescriptor **)&local_420);
        cVar7 = *(char *)((long)&e->piece_data_ + 2);
      }
      if (cVar7 == '\n') goto LAB_002de2b1;
      local_3d0._0_8_ = local_3d0 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_3d0,"&$0.Get(index)","");
      local_4b0._0_8_ = field_member._M_dataplus._M_p;
      local_4b0._8_4_ = (int)field_member._M_string_length;
      local_420.piece_data_ = (char *)0x0;
      local_420.piece_size_ = CONCAT44(local_420.piece_size_._4_4_,0xffffffff);
      local_3a0.piece_data_ = (char *)0x0;
      local_3a0.piece_size_ = CONCAT44(local_3a0.piece_size_._4_4_,0xffffffff);
      local_340.piece_data_ = (char *)0x0;
      local_340.piece_size_ = CONCAT44(local_340.piece_size_._4_4_,0xffffffff);
      local_370._0_8_ = (pointer)0x0;
      local_370._8_4_ = 0xffffffff;
      local_310.piece_data_ = (char *)0x0;
      local_310.piece_size_ = CONCAT44(local_310.piece_size_._4_4_,0xffffffff);
      local_200.text_ = (char *)0x0;
      local_200.size_ = -1;
      local_f0.text_ = (char *)0x0;
      local_f0.size_ = -1;
      local_120.text_ = (char *)0x0;
      local_120.size_ = -1;
      local_150.text_ = (char *)0x0;
      local_150.size_ = -1;
      strings::Substitute((string *)&local_230,(string *)local_3d0,(SubstituteArg *)local_4b0,
                          (SubstituteArg *)&local_420,(SubstituteArg *)&local_3a0,
                          (SubstituteArg *)&local_340,(SubstituteArg *)local_370,
                          (SubstituteArg *)&local_310,&local_200,&local_f0,&local_120,&local_150);
      std::__cxx11::string::operator=((string *)&prepared_template,(string *)&local_230);
      if (local_230.text_ != local_230.scratch_ + 4) {
        operator_delete(local_230.text_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3d0._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(local_3d0 + 0x10)) {
        operator_delete((void *)local_3d0._0_8_);
      }
      local_3d0._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(local_3d0 + 0x10);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_3d0,"&$0.Get($0.size() - 1)","");
      local_4b0._0_8_ = field_member._M_dataplus._M_p;
      local_4b0._8_4_ = (int)field_member._M_string_length;
      local_420.piece_data_ = (char *)0x0;
      local_420.piece_size_ = CONCAT44(local_420.piece_size_._4_4_,0xffffffff);
      local_3a0.piece_data_ = (char *)0x0;
      local_3a0.piece_size_ = CONCAT44(local_3a0.piece_size_._4_4_,0xffffffff);
      local_340.piece_data_ = (pointer)0x0;
      local_340.piece_size_ = CONCAT44(local_340.piece_size_._4_4_,0xffffffff);
      local_370._0_8_ = (AlphaNum *)0x0;
      local_370._8_4_ = 0xffffffff;
      local_310.piece_data_ = (pointer)0x0;
      local_310.piece_size_ = CONCAT44(local_310.piece_size_._4_4_,0xffffffff);
      local_200.text_ = (pointer)0x0;
      local_200.size_ = -1;
      local_f0.text_ = (char *)0x0;
      local_f0.size_ = -1;
      local_120.text_ = (char *)0x0;
      local_120.size_ = -1;
      local_150.text_ = (char *)0x0;
      local_150.size_ = -1;
      strings::Substitute((string *)&local_230,(string *)local_3d0,(SubstituteArg *)local_4b0,
                          (SubstituteArg *)&local_420,(SubstituteArg *)&local_3a0,
                          (SubstituteArg *)&local_340,(SubstituteArg *)local_370,
                          (SubstituteArg *)&local_310,&local_200,&local_f0,&local_120,&local_150);
      std::__cxx11::string::operator=((string *)&prepared_add_template,(string *)&local_230);
      if (local_230.text_ != local_230.scratch_ + 4) {
        operator_delete(local_230.text_);
      }
      _Var15._M_p = (pointer)local_3d0._0_8_;
      if ((undefined1 *)local_3d0._0_8_ != local_3d0 + 0x10) goto LAB_002debe1;
      goto LAB_002debe6;
    }
LAB_002de2b1:
    std::__cxx11::string::_M_replace
              ((ulong)&prepared_template,0,(char *)prepared_template._M_string_length,0x40b55f);
    psVar14 = &prepared_add_template;
LAB_002de2dd:
    std::__cxx11::string::_M_replace((ulong)psVar14,0,(char *)psVar14->_M_string_length,0x40b55f);
  }
  else {
LAB_002de11d:
    if (*(once_flag **)(((AlphaNum *)descriptor)->digits + 8) != (once_flag *)0x0) {
      local_4b0._0_8_ = FieldDescriptor::TypeOnceInit;
      local_420.piece_data_ = (char *)descriptor;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(((AlphaNum *)descriptor)->digits + 8),
                 (_func_void_FieldDescriptor_ptr **)local_4b0,(FieldDescriptor **)&local_420);
      descriptor = (FieldDescriptor *)e;
      e = (AlphaNum *)descriptor;
    }
    if ((*(char *)((long)&((AlphaNum *)descriptor)->piece_data_ + 2) == '\v') &&
       (bVar5 = FieldDescriptor::is_map_message_type(descriptor), descriptor = (FieldDescriptor *)e,
       e = (AlphaNum *)descriptor, bVar5)) {
LAB_002de2d8:
      psVar14 = &prepared_template;
      goto LAB_002de2dd;
    }
    if (*(once_flag **)(((AlphaNum *)descriptor)->digits + 8) != (once_flag *)0x0) {
      local_4b0._0_8_ = FieldDescriptor::TypeOnceInit;
      local_420.piece_data_ = (char *)descriptor;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(((AlphaNum *)descriptor)->digits + 8),
                 (_func_void_FieldDescriptor_ptr **)local_4b0,(FieldDescriptor **)&local_420);
      descriptor = (FieldDescriptor *)e;
      e = (AlphaNum *)descriptor;
    }
    bVar6 = *(byte *)((long)&((AlphaNum *)descriptor)->piece_data_ + 2);
    if ((bVar6 == 0xb) &&
       (*(char *)(((AlphaNum *)((long)descriptor + 0x30))->piece_size_ + 0x4d) == '\0'))
    goto LAB_002de2d8;
    if (*(once_flag **)(((AlphaNum *)descriptor)->digits + 8) != (once_flag *)0x0) {
      local_4b0._0_8_ = FieldDescriptor::TypeOnceInit;
      local_420.piece_data_ = (char *)descriptor;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(((AlphaNum *)descriptor)->digits + 8),
                 (_func_void_FieldDescriptor_ptr **)local_4b0,(FieldDescriptor **)&local_420);
      descriptor = (FieldDescriptor *)e;
      bVar6 = *(byte *)((long)&((AlphaNum *)descriptor)->piece_data_ + 2);
      e = (AlphaNum *)descriptor;
    }
    _Var15._M_p = field_member._M_dataplus._M_p;
    if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)bVar6 * 4) == 9) {
      if (bVar8) {
        pcVar13 = (char *)CONCAT44(field_member._M_string_length._4_4_,
                                   (int)field_member._M_string_length);
        if (field_member._M_string_length._4_4_ < 0) {
          stringpiece_internal::StringPiece::LogFatalSizeTooBig
                    ((size_t)pcVar13,"string length exceeds max size");
        }
        field_member_00.length_ = (size_type)pAVar17;
        field_member_00.ptr_ = pcVar13;
        (anonymous_namespace)::GenerateTemplateForSingleString_abi_cxx11_
                  ((string *)local_4b0,(_anonymous_namespace_ *)descriptor,
                   (FieldDescriptor *)_Var15._M_p,field_member_00);
        std::__cxx11::string::operator=((string *)&prepared_template,(string *)local_4b0);
        _Var15._M_p = (pointer)local_4b0._0_8_;
        if ((undefined1 *)local_4b0._0_8_ != local_4b0 + 0x10) goto LAB_002debe1;
      }
      else {
        local_2e0._M_dataplus._M_p = (pointer)&local_2e0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e0,"proto_ns","");
        pmVar9 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](variables,&local_2e0);
        pFVar11 = extraout_RDX_05;
        if ((long)pmVar9->_M_string_length < 0) {
          stringpiece_internal::StringPiece::LogFatalSizeTooBig
                    (pmVar9->_M_string_length,"string length exceeds max size");
          pFVar11 = extraout_RDX_06;
        }
        iVar4 = (int)field_member._M_string_length;
        _Var15._M_p = field_member._M_dataplus._M_p;
        if (field_member._M_string_length._4_4_ < 0) {
          stringpiece_internal::StringPiece::LogFatalSizeTooBig
                    (CONCAT44(field_member._M_string_length._4_4_,(int)field_member._M_string_length
                             ),"string length exceeds max size");
          pFVar11 = extraout_RDX_07;
        }
        FieldName_abi_cxx11_(&field_name,(cpp *)descriptor,pFVar11);
        iVar1 = *(int *)(((AlphaNum *)((long)descriptor + 0x30))->piece_size_ + 0x48);
        pcVar13 = "$0";
        if (iVar1 == 0) {
          pcVar13 = "$0.GetPointer()";
        }
        pcVar12 = pcVar13 + 2;
        if (iVar1 == 0) {
          pcVar12 = pcVar13 + 0xf;
        }
        field_pointer._M_dataplus._M_p = (pointer)&field_pointer.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&field_pointer,pcVar13,pcVar12);
        if (*(long *)(*(long *)((AlphaNum *)((long)descriptor + 0x30))->digits + 8) == 0) {
          local_4b0._0_8_ = "_internal_has_";
          local_4b0._8_8_ = 0xe;
          local_420.piece_data_ = field_name._M_dataplus._M_p;
          local_420.piece_size_ = field_name._M_string_length;
          local_3a0.piece_data_ = "() ? ";
          local_3a0.piece_size_ = 5;
          local_340.piece_data_ = field_pointer._M_dataplus._M_p;
          local_340.piece_size_ = field_pointer._M_string_length;
          local_370._0_8_ = ": nullptr";
          local_370._8_8_ = 9;
          StrCat_abi_cxx11_((string *)&local_280,(protobuf *)local_4b0,&local_420,&local_3a0,
                            &local_340,(AlphaNum *)local_370,e);
          local_310.piece_data_ = _Var15._M_p;
          local_310.piece_size_ = CONCAT44(local_310.piece_size_._4_4_,iVar4);
          local_200.text_ = (pointer)0x0;
          local_200.size_ = -1;
          local_f0.text_ = (char *)0x0;
          local_f0.size_ = -1;
          local_120.text_ = (char *)0x0;
          local_120.size_ = -1;
          local_150.text_ = (char *)0x0;
          local_150.size_ = -1;
          local_230.text_ = (char *)0x0;
          local_230.size_ = -1;
          local_3d0._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x0;
          local_3d0._8_4_ = -1;
          local_60.text_ = (char *)0x0;
          local_60.size_ = -1;
          local_90.text_ = (char *)0x0;
          local_90.size_ = -1;
          local_c0.text_ = (char *)0x0;
          local_c0.size_ = -1;
          strings::Substitute(&local_1b0,(string *)&local_280,(SubstituteArg *)&local_310,&local_200
                              ,&local_f0,&local_120,&local_150,&local_230,(SubstituteArg *)local_3d0
                              ,&local_60,&local_90,&local_c0);
          _Var15._M_p = local_280.text_;
          if (local_280.text_ != local_280.scratch_ + 4) goto LAB_002deb75;
        }
        else {
          iVar1 = *(int *)(((AlphaNum *)((long)descriptor + 0x30))->piece_size_ + 0x48);
          if (iVar1 == 2) {
            local_4b0._0_8_ = "_internal_has_";
            local_4b0._8_8_ = 0xe;
            local_420.piece_data_ = field_name._M_dataplus._M_p;
            local_420.piece_size_ = field_name._M_string_length;
            local_3a0.piece_data_ = "() ? ";
            local_3a0.piece_size_ = 5;
            local_340.piece_data_ = field_pointer._M_dataplus._M_p;
            local_340.piece_size_ = field_pointer._M_string_length;
            local_370._0_8_ = ": nullptr";
            local_370._8_8_ = 9;
            StrCat_abi_cxx11_((string *)&local_280,(protobuf *)local_4b0,&local_420,&local_3a0,
                              &local_340,(AlphaNum *)local_370,e);
            local_310.piece_data_ = _Var15._M_p;
            local_310.piece_size_ = CONCAT44(local_310.piece_size_._4_4_,iVar4);
            local_200.text_ = (pointer)0x0;
            local_200.size_ = -1;
            local_f0.text_ = (char *)0x0;
            local_f0.size_ = -1;
            local_120.text_ = (char *)0x0;
            local_120.size_ = -1;
            local_150.text_ = (char *)0x0;
            local_150.size_ = -1;
            local_230.text_ = (char *)0x0;
            local_230.size_ = -1;
            local_3d0._0_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0x0;
            local_3d0._8_4_ = -1;
            local_60.text_ = (char *)0x0;
            local_60.size_ = -1;
            local_90.text_ = (char *)0x0;
            local_90.size_ = -1;
            local_c0.text_ = (char *)0x0;
            local_c0.size_ = -1;
            strings::Substitute(&local_1b0,(string *)&local_280,(SubstituteArg *)&local_310,
                                &local_200,&local_f0,&local_120,&local_150,&local_230,
                                (SubstituteArg *)local_3d0,&local_60,&local_90,&local_c0);
            _Var15._M_p = local_280.text_;
            if (local_280.text_ != local_280.scratch_ + 4) {
LAB_002deb75:
              operator_delete(_Var15._M_p);
            }
          }
          else {
            pcVar13 = "&$1";
            if (iVar1 == 0) {
              pcVar13 = "&$1.get()";
            }
            pcVar12 = pcVar13 + 3;
            if (iVar1 == 0) {
              pcVar12 = pcVar13 + 9;
            }
            pAVar17 = (AlphaNum *)0x2de9a1;
            default_value_pointer._M_dataplus._M_p = (pointer)&default_value_pointer.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&default_value_pointer,pcVar13,pcVar12);
            local_4b0._0_8_ = "_internal_has_";
            local_4b0._8_8_ = 0xe;
            local_420.piece_data_ = field_name._M_dataplus._M_p;
            local_420.piece_size_ = field_name._M_string_length;
            local_3a0.piece_data_ = "() ? ";
            local_3a0.piece_size_ = 5;
            local_340.piece_data_ = field_pointer._M_dataplus._M_p;
            local_340.piece_size_ = field_pointer._M_string_length;
            local_370._0_8_ = " : ";
            local_370._8_8_ = 3;
            local_310.piece_data_ = default_value_pointer._M_dataplus._M_p;
            local_310.piece_size_ = default_value_pointer._M_string_length;
            StrCat_abi_cxx11_(&local_170,(protobuf *)local_4b0,&local_420,&local_3a0,&local_340,
                              (AlphaNum *)local_370,&local_310,pAVar17);
            local_200.text_ = _Var15._M_p;
            local_200.size_ = iVar4;
            MakeDefaultName_abi_cxx11_(&local_190,(cpp *)e,field);
            local_f0.text_ = local_190._M_dataplus._M_p;
            local_f0.size_ = (int)local_190._M_string_length;
            local_120.text_ = (char *)0x0;
            local_120.size_ = -1;
            local_150.text_ = (char *)0x0;
            local_150.size_ = -1;
            local_230.text_ = (char *)0x0;
            local_230.size_ = -1;
            local_3d0._0_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0x0;
            local_3d0._8_4_ = -1;
            local_60.text_ = (char *)0x0;
            local_60.size_ = -1;
            local_90.text_ = (char *)0x0;
            local_90.size_ = -1;
            local_c0.text_ = (char *)0x0;
            local_c0.size_ = -1;
            local_280.text_ = (pointer)0x0;
            local_280.size_ = -1;
            strings::Substitute(&local_1b0,&local_170,&local_200,&local_f0,&local_120,&local_150,
                                &local_230,(SubstituteArg *)local_3d0,&local_60,&local_90,&local_c0,
                                &local_280);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_190._M_dataplus._M_p != &local_190.field_2) {
              operator_delete(local_190._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_170._M_dataplus._M_p != &local_170.field_2) {
              operator_delete(local_170._M_dataplus._M_p);
            }
            _Var15._M_p = default_value_pointer._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)default_value_pointer._M_dataplus._M_p != &default_value_pointer.field_2)
            goto LAB_002deb75;
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)field_pointer._M_dataplus._M_p != &field_pointer.field_2) {
          operator_delete(field_pointer._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)field_name._M_dataplus._M_p != &field_name.field_2) {
          operator_delete(field_name._M_dataplus._M_p);
        }
        std::__cxx11::string::operator=((string *)&prepared_template,(string *)&local_1b0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
          operator_delete(local_1b0._M_dataplus._M_p);
        }
        _Var15._M_p = local_2e0._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) goto LAB_002debe1;
      }
    }
    else {
      local_4b0._0_8_ = "&";
      local_4b0._8_8_ = 1;
      local_420.piece_size_ =
           CONCAT44(field_member._M_string_length._4_4_,(int)field_member._M_string_length);
      local_420.piece_data_ = field_member._M_dataplus._M_p;
      StrCat_abi_cxx11_((string *)&local_3a0,(protobuf *)local_4b0,&local_420,
                        (AlphaNum *)FieldDescriptor::kTypeToCppTypeMap);
      std::__cxx11::string::operator=((string *)&prepared_template,(string *)&local_3a0);
      _Var15._M_p = local_3a0.piece_data_;
      if (local_3a0.piece_data_ != local_3a0.digits) {
LAB_002debe1:
        operator_delete(_Var15._M_p);
      }
    }
  }
LAB_002debe6:
  pAVar17 = e;
  if ((~*(byte *)((long)&e->piece_data_ + 1) & 0x60) == 0) {
    if (*(once_flag **)(e->digits + 8) != (once_flag *)0x0) {
      local_4b0._0_8_ = FieldDescriptor::TypeOnceInit;
      local_420.piece_data_ = (char *)e;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(e->digits + 8),(_func_void_FieldDescriptor_ptr **)local_4b0,
                 (FieldDescriptor **)&local_420);
    }
    if ((*(char *)((long)&e->piece_data_ + 2) != '\v') ||
       (bVar8 = FieldDescriptor::is_map_message_type((FieldDescriptor *)e), pAVar17 = e, !bVar8)) {
      if (*(once_flag **)(e->digits + 8) != (once_flag *)0x0) {
        local_4b0._0_8_ = FieldDescriptor::TypeOnceInit;
        local_420.piece_data_ = (char *)e;
        std::
        call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                  (*(once_flag **)(e->digits + 8),(_func_void_FieldDescriptor_ptr **)local_4b0,
                   (FieldDescriptor **)&local_420);
      }
      cVar7 = *(char *)((long)&e->piece_data_ + 2);
      pAVar17 = e;
      if (cVar7 != '\v') {
        if (*(once_flag **)(e->digits + 8) != (once_flag *)0x0) {
          local_4b0._0_8_ = FieldDescriptor::TypeOnceInit;
          local_420.piece_data_ = (char *)e;
          std::
          call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                    (*(once_flag **)(e->digits + 8),(_func_void_FieldDescriptor_ptr **)local_4b0,
                     (FieldDescriptor **)&local_420);
          cVar7 = *(char *)((long)&pAVar17->piece_data_ + 2);
        }
        if (cVar7 != '\n') {
          local_4b0._0_8_ = "&";
          local_4b0._8_8_ = 1;
          local_420.piece_size_ =
               CONCAT44(field_member._M_string_length._4_4_,(int)field_member._M_string_length);
          local_420.piece_data_ = field_member._M_dataplus._M_p;
          StrCat_abi_cxx11_((string *)&local_3a0,(protobuf *)local_4b0,&local_420,e);
          std::__cxx11::string::operator=((string *)&prepared_flat_template,(string *)&local_3a0);
          if (local_3a0.piece_data_ != local_3a0.digits) {
            operator_delete(local_3a0.piece_data_);
          }
          goto LAB_002decb5;
        }
      }
    }
  }
  std::__cxx11::string::_M_assign((string *)&prepared_flat_template);
LAB_002decb5:
  substitute_template_prefix_00.length_ = substitute_template_prefix._M_string_length;
  substitute_template_prefix_00.ptr_ = substitute_template_prefix._M_dataplus._M_p;
  if ((long)substitute_template_prefix._M_string_length < 0) {
    stringpiece_internal::StringPiece::LogFatalSizeTooBig
              (substitute_template_prefix._M_string_length,"string length exceeds max size");
  }
  sVar3 = prepared_template._M_string_length;
  _Var15._M_p = prepared_template._M_dataplus._M_p;
  if ((long)prepared_template._M_string_length < 0) {
    stringpiece_internal::StringPiece::LogFatalSizeTooBig
              (prepared_template._M_string_length,"string length exceeds max size");
  }
  if (((ulong)pAVar17->piece_data_ & 0x800) == 0) {
    plVar10 = (long *)(*(long *)(pAVar17->digits + 0x10) + 0x28);
  }
  else if (*(long *)(pAVar17->digits + 0x18) == 0) {
    plVar10 = (long *)(*(long *)pAVar17->digits + 0x70);
  }
  else {
    plVar10 = (long *)(*(long *)(pAVar17->digits + 0x18) + 0x50);
  }
  prepared_template_00.length_._0_4_ = (int)((ulong)((long)pAVar17 - *plVar10) >> 3) * 0x38e38e39;
  prepared_template_00.ptr_ = (char *)sVar3;
  prepared_template_00.length_._4_4_ = 0;
  access_type.length_ = 5;
  access_type.ptr_ = "OnGet";
  annotation_name.length_ = 3;
  annotation_name.ptr_ = "get";
  anon_unknown_7::MaySetAnnotationVariable
            (options,annotation_name,substitute_template_prefix_00,prepared_template_00,
             (int)_Var15._M_p,access_type,variables);
  substitute_template_prefix_01.length_ = substitute_template_prefix._M_string_length;
  substitute_template_prefix_01.ptr_ = substitute_template_prefix._M_dataplus._M_p;
  if ((long)substitute_template_prefix._M_string_length < 0) {
    stringpiece_internal::StringPiece::LogFatalSizeTooBig
              (substitute_template_prefix._M_string_length,"string length exceeds max size");
  }
  sVar3 = prepared_template._M_string_length;
  _Var15._M_p = prepared_template._M_dataplus._M_p;
  if ((long)prepared_template._M_string_length < 0) {
    stringpiece_internal::StringPiece::LogFatalSizeTooBig
              (prepared_template._M_string_length,"string length exceeds max size");
  }
  if (((ulong)pAVar17->piece_data_ & 0x800) == 0) {
    plVar10 = (long *)(*(long *)(pAVar17->digits + 0x10) + 0x28);
  }
  else if (*(long *)(pAVar17->digits + 0x18) == 0) {
    plVar10 = (long *)(*(long *)pAVar17->digits + 0x70);
  }
  else {
    plVar10 = (long *)(*(long *)(pAVar17->digits + 0x18) + 0x50);
  }
  prepared_template_01.length_._0_4_ = (int)((ulong)((long)pAVar17 - *plVar10) >> 3) * 0x38e38e39;
  prepared_template_01.ptr_ = (char *)sVar3;
  prepared_template_01.length_._4_4_ = 0;
  access_type_00.length_ = 5;
  access_type_00.ptr_ = "OnSet";
  annotation_name_00.length_ = 3;
  annotation_name_00.ptr_ = "set";
  anon_unknown_7::MaySetAnnotationVariable
            (options,annotation_name_00,substitute_template_prefix_01,prepared_template_01,
             (int)_Var15._M_p,access_type_00,variables);
  substitute_template_prefix_02.length_ = substitute_template_prefix._M_string_length;
  substitute_template_prefix_02.ptr_ = substitute_template_prefix._M_dataplus._M_p;
  if ((long)substitute_template_prefix._M_string_length < 0) {
    stringpiece_internal::StringPiece::LogFatalSizeTooBig
              (substitute_template_prefix._M_string_length,"string length exceeds max size");
  }
  sVar3 = prepared_template._M_string_length;
  _Var15._M_p = prepared_template._M_dataplus._M_p;
  if ((long)prepared_template._M_string_length < 0) {
    stringpiece_internal::StringPiece::LogFatalSizeTooBig
              (prepared_template._M_string_length,"string length exceeds max size");
  }
  if (((ulong)pAVar17->piece_data_ & 0x800) == 0) {
    plVar10 = (long *)(*(long *)(pAVar17->digits + 0x10) + 0x28);
  }
  else if (*(long *)(pAVar17->digits + 0x18) == 0) {
    plVar10 = (long *)(*(long *)pAVar17->digits + 0x70);
  }
  else {
    plVar10 = (long *)(*(long *)(pAVar17->digits + 0x18) + 0x50);
  }
  prepared_template_02.length_._0_4_ = (int)((ulong)((long)pAVar17 - *plVar10) >> 3) * 0x38e38e39;
  prepared_template_02.ptr_ = (char *)sVar3;
  prepared_template_02.length_._4_4_ = 0;
  access_type_01.length_ = 5;
  access_type_01.ptr_ = "OnHas";
  annotation_name_01.length_ = 3;
  annotation_name_01.ptr_ = "has";
  anon_unknown_7::MaySetAnnotationVariable
            (options,annotation_name_01,substitute_template_prefix_02,prepared_template_02,
             (int)_Var15._M_p,access_type_01,variables);
  substitute_template_prefix_03.length_ = substitute_template_prefix._M_string_length;
  substitute_template_prefix_03.ptr_ = substitute_template_prefix._M_dataplus._M_p;
  if ((long)substitute_template_prefix._M_string_length < 0) {
    stringpiece_internal::StringPiece::LogFatalSizeTooBig
              (substitute_template_prefix._M_string_length,"string length exceeds max size");
  }
  sVar3 = prepared_template._M_string_length;
  _Var15._M_p = prepared_template._M_dataplus._M_p;
  if ((long)prepared_template._M_string_length < 0) {
    stringpiece_internal::StringPiece::LogFatalSizeTooBig
              (prepared_template._M_string_length,"string length exceeds max size");
  }
  if (((ulong)pAVar17->piece_data_ & 0x800) == 0) {
    plVar10 = (long *)(*(long *)(pAVar17->digits + 0x10) + 0x28);
  }
  else if (*(long *)(pAVar17->digits + 0x18) == 0) {
    plVar10 = (long *)(*(long *)pAVar17->digits + 0x70);
  }
  else {
    plVar10 = (long *)(*(long *)(pAVar17->digits + 0x18) + 0x50);
  }
  prepared_template_03.length_._0_4_ = (int)((ulong)((long)pAVar17 - *plVar10) >> 3) * 0x38e38e39;
  prepared_template_03.ptr_ = (char *)sVar3;
  prepared_template_03.length_._4_4_ = 0;
  access_type_02.length_ = 9;
  access_type_02.ptr_ = "OnMutable";
  annotation_name_02.length_ = 7;
  annotation_name_02.ptr_ = "mutable";
  anon_unknown_7::MaySetAnnotationVariable
            (options,annotation_name_02,substitute_template_prefix_03,prepared_template_03,
             (int)_Var15._M_p,access_type_02,variables);
  substitute_template_prefix_04.length_ = substitute_template_prefix._M_string_length;
  substitute_template_prefix_04.ptr_ = substitute_template_prefix._M_dataplus._M_p;
  if ((long)substitute_template_prefix._M_string_length < 0) {
    stringpiece_internal::StringPiece::LogFatalSizeTooBig
              (substitute_template_prefix._M_string_length,"string length exceeds max size");
  }
  sVar3 = prepared_template._M_string_length;
  _Var15._M_p = prepared_template._M_dataplus._M_p;
  if ((long)prepared_template._M_string_length < 0) {
    stringpiece_internal::StringPiece::LogFatalSizeTooBig
              (prepared_template._M_string_length,"string length exceeds max size");
  }
  if (((ulong)pAVar17->piece_data_ & 0x800) == 0) {
    plVar10 = (long *)(*(long *)(pAVar17->digits + 0x10) + 0x28);
  }
  else if (*(long *)(pAVar17->digits + 0x18) == 0) {
    plVar10 = (long *)(*(long *)pAVar17->digits + 0x70);
  }
  else {
    plVar10 = (long *)(*(long *)(pAVar17->digits + 0x18) + 0x50);
  }
  prepared_template_04.length_._0_4_ = (int)((ulong)((long)pAVar17 - *plVar10) >> 3) * 0x38e38e39;
  prepared_template_04.ptr_ = (char *)sVar3;
  prepared_template_04.length_._4_4_ = 0;
  access_type_03.length_ = 9;
  access_type_03.ptr_ = "OnRelease";
  annotation_name_03.length_ = 7;
  annotation_name_03.ptr_ = "release";
  anon_unknown_7::MaySetAnnotationVariable
            (options,annotation_name_03,substitute_template_prefix_04,prepared_template_04,
             (int)_Var15._M_p,access_type_03,variables);
  substitute_template_prefix_05.length_ = substitute_template_prefix._M_string_length;
  substitute_template_prefix_05.ptr_ = substitute_template_prefix._M_dataplus._M_p;
  if ((long)substitute_template_prefix._M_string_length < 0) {
    stringpiece_internal::StringPiece::LogFatalSizeTooBig
              (substitute_template_prefix._M_string_length,"string length exceeds max size");
  }
  sVar3 = prepared_flat_template._M_string_length;
  _Var15._M_p = prepared_flat_template._M_dataplus._M_p;
  if ((long)prepared_flat_template._M_string_length < 0) {
    stringpiece_internal::StringPiece::LogFatalSizeTooBig
              (prepared_flat_template._M_string_length,"string length exceeds max size");
  }
  if (((ulong)pAVar17->piece_data_ & 0x800) == 0) {
    plVar10 = (long *)(*(long *)(pAVar17->digits + 0x10) + 0x28);
  }
  else if (*(long *)(pAVar17->digits + 0x18) == 0) {
    plVar10 = (long *)(*(long *)pAVar17->digits + 0x70);
  }
  else {
    plVar10 = (long *)(*(long *)(pAVar17->digits + 0x18) + 0x50);
  }
  prepared_template_05.length_._0_4_ = (int)((ulong)((long)pAVar17 - *plVar10) >> 3) * 0x38e38e39;
  prepared_template_05.ptr_ = (char *)sVar3;
  prepared_template_05.length_._4_4_ = 0;
  access_type_04.length_ = 7;
  access_type_04.ptr_ = "OnClear";
  annotation_name_04.length_ = 5;
  annotation_name_04.ptr_ = "clear";
  anon_unknown_7::MaySetAnnotationVariable
            (options,annotation_name_04,substitute_template_prefix_05,prepared_template_05,
             (int)_Var15._M_p,access_type_04,variables);
  substitute_template_prefix_06.length_ = substitute_template_prefix._M_string_length;
  substitute_template_prefix_06.ptr_ = substitute_template_prefix._M_dataplus._M_p;
  if ((long)substitute_template_prefix._M_string_length < 0) {
    stringpiece_internal::StringPiece::LogFatalSizeTooBig
              (substitute_template_prefix._M_string_length,"string length exceeds max size");
  }
  sVar3 = prepared_flat_template._M_string_length;
  _Var15._M_p = prepared_flat_template._M_dataplus._M_p;
  if ((long)prepared_flat_template._M_string_length < 0) {
    stringpiece_internal::StringPiece::LogFatalSizeTooBig
              (prepared_flat_template._M_string_length,"string length exceeds max size");
  }
  if (((ulong)pAVar17->piece_data_ & 0x800) == 0) {
    plVar10 = (long *)(*(long *)(pAVar17->digits + 0x10) + 0x28);
  }
  else if (*(long *)(pAVar17->digits + 0x18) == 0) {
    plVar10 = (long *)(*(long *)pAVar17->digits + 0x70);
  }
  else {
    plVar10 = (long *)(*(long *)(pAVar17->digits + 0x18) + 0x50);
  }
  prepared_template_06.length_._0_4_ = (int)((ulong)((long)pAVar17 - *plVar10) >> 3) * 0x38e38e39;
  prepared_template_06.ptr_ = (char *)sVar3;
  prepared_template_06.length_._4_4_ = 0;
  access_type_05.length_ = 6;
  access_type_05.ptr_ = "OnSize";
  annotation_name_05.length_ = 4;
  annotation_name_05.ptr_ = "size";
  anon_unknown_7::MaySetAnnotationVariable
            (options,annotation_name_05,substitute_template_prefix_06,prepared_template_06,
             (int)_Var15._M_p,access_type_05,variables);
  substitute_template_prefix_07.length_ = substitute_template_prefix._M_string_length;
  substitute_template_prefix_07.ptr_ = substitute_template_prefix._M_dataplus._M_p;
  if ((long)substitute_template_prefix._M_string_length < 0) {
    stringpiece_internal::StringPiece::LogFatalSizeTooBig
              (substitute_template_prefix._M_string_length,"string length exceeds max size");
  }
  sVar3 = prepared_flat_template._M_string_length;
  _Var15._M_p = prepared_flat_template._M_dataplus._M_p;
  if ((long)prepared_flat_template._M_string_length < 0) {
    stringpiece_internal::StringPiece::LogFatalSizeTooBig
              (prepared_flat_template._M_string_length,"string length exceeds max size");
  }
  if (((ulong)pAVar17->piece_data_ & 0x800) == 0) {
    plVar10 = (long *)(*(long *)(pAVar17->digits + 0x10) + 0x28);
  }
  else if (*(long *)(pAVar17->digits + 0x18) == 0) {
    plVar10 = (long *)(*(long *)pAVar17->digits + 0x70);
  }
  else {
    plVar10 = (long *)(*(long *)(pAVar17->digits + 0x18) + 0x50);
  }
  prepared_template_07.length_._0_4_ = (int)((ulong)((long)pAVar17 - *plVar10) >> 3) * 0x38e38e39;
  prepared_template_07.ptr_ = (char *)sVar3;
  prepared_template_07.length_._4_4_ = 0;
  access_type_06.length_ = 6;
  access_type_06.ptr_ = "OnList";
  annotation_name_06.length_ = 4;
  annotation_name_06.ptr_ = "list";
  anon_unknown_7::MaySetAnnotationVariable
            (options,annotation_name_06,substitute_template_prefix_07,prepared_template_07,
             (int)_Var15._M_p,access_type_06,variables);
  substitute_template_prefix_08.length_ = substitute_template_prefix._M_string_length;
  substitute_template_prefix_08.ptr_ = substitute_template_prefix._M_dataplus._M_p;
  if ((long)substitute_template_prefix._M_string_length < 0) {
    stringpiece_internal::StringPiece::LogFatalSizeTooBig
              (substitute_template_prefix._M_string_length,"string length exceeds max size");
  }
  sVar3 = prepared_flat_template._M_string_length;
  _Var15._M_p = prepared_flat_template._M_dataplus._M_p;
  if ((long)prepared_flat_template._M_string_length < 0) {
    stringpiece_internal::StringPiece::LogFatalSizeTooBig
              (prepared_flat_template._M_string_length,"string length exceeds max size");
  }
  if (((ulong)pAVar17->piece_data_ & 0x800) == 0) {
    plVar10 = (long *)(*(long *)(pAVar17->digits + 0x10) + 0x28);
  }
  else if (*(long *)(pAVar17->digits + 0x18) == 0) {
    plVar10 = (long *)(*(long *)pAVar17->digits + 0x70);
  }
  else {
    plVar10 = (long *)(*(long *)(pAVar17->digits + 0x18) + 0x50);
  }
  prepared_template_08.length_._0_4_ = (int)((ulong)((long)pAVar17 - *plVar10) >> 3) * 0x38e38e39;
  prepared_template_08.ptr_ = (char *)sVar3;
  prepared_template_08.length_._4_4_ = 0;
  access_type_07.length_ = 0xd;
  access_type_07.ptr_ = "OnMutableList";
  annotation_name_07.length_ = 0xc;
  annotation_name_07.ptr_ = "mutable_list";
  anon_unknown_7::MaySetAnnotationVariable
            (options,annotation_name_07,substitute_template_prefix_08,prepared_template_08,
             (int)_Var15._M_p,access_type_07,variables);
  substitute_template_prefix_09.length_ = substitute_template_prefix._M_string_length;
  substitute_template_prefix_09.ptr_ = substitute_template_prefix._M_dataplus._M_p;
  if ((long)substitute_template_prefix._M_string_length < 0) {
    stringpiece_internal::StringPiece::LogFatalSizeTooBig
              (substitute_template_prefix._M_string_length,"string length exceeds max size");
  }
  sVar3 = prepared_add_template._M_string_length;
  _Var15._M_p = prepared_add_template._M_dataplus._M_p;
  if ((long)prepared_add_template._M_string_length < 0) {
    stringpiece_internal::StringPiece::LogFatalSizeTooBig
              (prepared_add_template._M_string_length,"string length exceeds max size");
  }
  if (((ulong)pAVar17->piece_data_ & 0x800) == 0) {
    plVar10 = (long *)(*(long *)(pAVar17->digits + 0x10) + 0x28);
  }
  else if (*(long *)(pAVar17->digits + 0x18) == 0) {
    plVar10 = (long *)(*(long *)pAVar17->digits + 0x70);
  }
  else {
    plVar10 = (long *)(*(long *)(pAVar17->digits + 0x18) + 0x50);
  }
  prepared_template_09.length_._0_4_ = (int)((ulong)((long)pAVar17 - *plVar10) >> 3) * 0x38e38e39;
  prepared_template_09.ptr_ = (char *)sVar3;
  prepared_template_09.length_._4_4_ = 0;
  access_type_08.length_ = 5;
  access_type_08.ptr_ = "OnAdd";
  annotation_name_08.length_ = 3;
  annotation_name_08.ptr_ = "add";
  anon_unknown_7::MaySetAnnotationVariable
            (options,annotation_name_08,substitute_template_prefix_09,prepared_template_09,
             (int)_Var15._M_p,access_type_08,variables);
  substitute_template_prefix_10.length_ = substitute_template_prefix._M_string_length;
  substitute_template_prefix_10.ptr_ = substitute_template_prefix._M_dataplus._M_p;
  if ((long)substitute_template_prefix._M_string_length < 0) {
    stringpiece_internal::StringPiece::LogFatalSizeTooBig
              (substitute_template_prefix._M_string_length,"string length exceeds max size");
  }
  sVar3 = prepared_add_template._M_string_length;
  _Var15._M_p = prepared_add_template._M_dataplus._M_p;
  if ((long)prepared_add_template._M_string_length < 0) {
    stringpiece_internal::StringPiece::LogFatalSizeTooBig
              (prepared_add_template._M_string_length,"string length exceeds max size");
  }
  if (((ulong)pAVar17->piece_data_ & 0x800) == 0) {
    plVar10 = (long *)(*(long *)(pAVar17->digits + 0x10) + 0x28);
  }
  else if (*(long *)(pAVar17->digits + 0x18) == 0) {
    plVar10 = (long *)(*(long *)pAVar17->digits + 0x70);
  }
  else {
    plVar10 = (long *)(*(long *)(pAVar17->digits + 0x18) + 0x50);
  }
  prepared_template_10.length_._0_4_ = (int)((ulong)((long)pAVar17 - *plVar10) >> 3) * 0x38e38e39;
  prepared_template_10.ptr_ = (char *)sVar3;
  prepared_template_10.length_._4_4_ = 0;
  access_type_09.length_ = 0xc;
  access_type_09.ptr_ = "OnAddMutable";
  annotation_name_09.length_ = 0xb;
  annotation_name_09.ptr_ = "add_mutable";
  anon_unknown_7::MaySetAnnotationVariable
            (options,annotation_name_09,substitute_template_prefix_10,prepared_template_10,
             (int)_Var15._M_p,access_type_09,variables);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)prepared_add_template._M_dataplus._M_p != &prepared_add_template.field_2) {
    operator_delete(prepared_add_template._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)prepared_flat_template._M_dataplus._M_p != &prepared_flat_template.field_2) {
    operator_delete(prepared_flat_template._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)prepared_template._M_dataplus._M_p != &prepared_template.field_2) {
    operator_delete(prepared_template._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)substitute_template_prefix._M_dataplus._M_p != &substitute_template_prefix.field_2) {
    operator_delete(substitute_template_prefix._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)proto_ns._M_dataplus._M_p != &proto_ns.field_2) {
    operator_delete(proto_ns._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)field_member._M_dataplus._M_p != &field_member.field_2) {
    operator_delete(field_member._M_dataplus._M_p);
  }
  return;
}

Assistant:

void AddAccessorAnnotations(const FieldDescriptor* descriptor,
                            const Options& options,
                            std::map<std::string, std::string>* variables) {
  // Can be expanded to include more specific calls, for example, for arena or
  // clear calls.
  static constexpr const char* kAccessorsAnnotations[] = {
      "annotate_add",     "annotate_get",         "annotate_has",
      "annotate_list",    "annotate_mutable",     "annotate_mutable_list",
      "annotate_release", "annotate_set",         "annotate_size",
      "annotate_clear",   "annotate_add_mutable",
  };
  for (size_t i = 0; i < GOOGLE_ARRAYSIZE(kAccessorsAnnotations); ++i) {
    (*variables)[kAccessorsAnnotations[i]] = "";
  }
  if (options.annotate_accessor) {
    for (size_t i = 0; i < GOOGLE_ARRAYSIZE(kAccessorsAnnotations); ++i) {
      (*variables)[kAccessorsAnnotations[i]] = StrCat(
          "  ", FieldName(descriptor), "_AccessedNoStrip = true;\n");
    }
  }
  if (!options.field_listener_options.inject_field_listener_events) {
    return;
  }
  if (descriptor->file()->options().optimize_for() ==
      google::protobuf::FileOptions::LITE_RUNTIME) {
    return;
  }
  std::string field_member = (*variables)["field_member"];
  const google::protobuf::OneofDescriptor* oneof_member =
      descriptor->real_containing_oneof();
  if (oneof_member) {
    field_member = StrCat(oneof_member->name(), "_.", field_member);
  }
  const std::string proto_ns = (*variables)["proto_ns"];
  const std::string substitute_template_prefix = "  _tracker_.$1<$0>(this, ";
  std::string prepared_template;

  // Flat template is needed if the prepared one is introspecting the values
  // inside the returned values, for example, for repeated fields and maps.
  std::string prepared_flat_template;
  std::string prepared_add_template;
  // TODO(b/190614678): Support fields with type Message or Map.
  if (descriptor->is_repeated() && !descriptor->is_map()) {
    if (descriptor->type() != FieldDescriptor::TYPE_MESSAGE &&
        descriptor->type() != FieldDescriptor::TYPE_GROUP) {
      prepared_template = strings::Substitute("&$0.Get(index)", field_member);
      prepared_add_template =
          strings::Substitute("&$0.Get($0.size() - 1)", field_member);
    } else {
      prepared_template = "nullptr";
      prepared_add_template = "nullptr";
    }
  } else if (descriptor->is_map()) {
    prepared_template = "nullptr";
  } else if (descriptor->type() == FieldDescriptor::TYPE_MESSAGE &&
             !descriptor->options().lazy()) {
    prepared_template = "nullptr";
  } else if (descriptor->cpp_type() == FieldDescriptor::CPPTYPE_STRING) {
    if (oneof_member) {
      prepared_template = GenerateTemplateForOneofString(
          descriptor, (*variables)["proto_ns"], field_member);
    } else {
      prepared_template =
          GenerateTemplateForSingleString(descriptor, field_member);
    }
  } else {
    prepared_template = StrCat("&", field_member);
  }
  if (descriptor->is_repeated() && !descriptor->is_map() &&
      descriptor->type() != FieldDescriptor::TYPE_MESSAGE &&
      descriptor->type() != FieldDescriptor::TYPE_GROUP) {
    prepared_flat_template = StrCat("&", field_member);
  } else {
    prepared_flat_template = prepared_template;
  }

  MaySetAnnotationVariable(options, "get", substitute_template_prefix,
                           prepared_template, descriptor->index(), "OnGet",
                           variables);
  MaySetAnnotationVariable(options, "set", substitute_template_prefix,
                           prepared_template, descriptor->index(), "OnSet",
                           variables);
  MaySetAnnotationVariable(options, "has", substitute_template_prefix,
                           prepared_template, descriptor->index(), "OnHas",
                           variables);
  MaySetAnnotationVariable(options, "mutable", substitute_template_prefix,
                           prepared_template, descriptor->index(), "OnMutable",
                           variables);
  MaySetAnnotationVariable(options, "release", substitute_template_prefix,
                           prepared_template, descriptor->index(), "OnRelease",
                           variables);
  MaySetAnnotationVariable(options, "clear", substitute_template_prefix,
                           prepared_flat_template, descriptor->index(),
                           "OnClear", variables);
  MaySetAnnotationVariable(options, "size", substitute_template_prefix,
                           prepared_flat_template, descriptor->index(),
                           "OnSize", variables);
  MaySetAnnotationVariable(options, "list", substitute_template_prefix,
                           prepared_flat_template, descriptor->index(),
                           "OnList", variables);
  MaySetAnnotationVariable(options, "mutable_list", substitute_template_prefix,
                           prepared_flat_template, descriptor->index(),
                           "OnMutableList", variables);
  MaySetAnnotationVariable(options, "add", substitute_template_prefix,
                           prepared_add_template, descriptor->index(), "OnAdd",
                           variables);
  MaySetAnnotationVariable(options, "add_mutable", substitute_template_prefix,
                           prepared_add_template, descriptor->index(),
                           "OnAddMutable", variables);
}